

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

string * Lexer::dequote(string *__return_storage_ptr__,string *input,string *quotes)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  size_t len;
  int quote;
  string *quotes_local;
  string *input_local;
  
  uVar2 = std::__cxx11::string::length();
  if (1 < uVar2) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)input);
    cVar1 = *pcVar3;
    lVar4 = std::__cxx11::string::find((char)quotes,(ulong)(uint)(int)cVar1);
    if (lVar4 != -1) {
      std::__cxx11::string::length();
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)input);
      if (cVar1 == *pcVar3) {
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)input);
        return __return_storage_ptr__;
      }
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input);
  return __return_storage_ptr__;
}

Assistant:

std::string Lexer::dequote (const std::string& input, const std::string& quotes)
{
  if (input.length () > 1)
  {
    int quote = input[0];
    if (quotes.find (quote) != std::string::npos)
    {
      size_t len = input.length ();
      if (quote == input[len - 1])
        return input.substr (1, len - 2);
    }
  }

  return input;
}